

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

mi_segment_t *
mi_segment_alloc(size_t required,size_t page_alignment,mi_arena_id_t req_arena_id,
                mi_segments_tld_t *tld,mi_page_t **huge_page)

{
  mi_segment_t *pmVar1;
  size_t sVar2;
  mi_segments_tld_t *pmVar3;
  mi_threadid_t mVar4;
  uintptr_t uVar5;
  mi_page_t *pmVar6;
  mi_stat_count_t *in_RCX;
  long in_RDI;
  undefined8 *in_R8;
  uint uVar7;
  undefined1 unaff_retaddr;
  size_t *in_stack_00000008;
  size_t *in_stack_00000010;
  mi_arena_id_t in_stack_00000018;
  _Bool in_stack_0000001f;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  mi_page_t *page0;
  size_t guard_slices;
  size_t slice_entries;
  size_t zsize;
  size_t prefix;
  ptrdiff_t ofs;
  mi_segment_t *segment;
  _Bool commit;
  _Bool eager;
  _Bool eager_delay;
  size_t segment_slices;
  size_t info_slices;
  mi_option_t in_stack_ffffffffffffff4c;
  mi_segment_t *local_a0;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  _Bool _Var8;
  mi_segments_tld_t *in_stack_ffffffffffffff70;
  undefined1 allow_purge;
  mi_segment_t *in_stack_ffffffffffffff98;
  size_t local_38;
  mi_segment_t *local_8;
  
  pmVar1 = (mi_segment_t *)
           mi_segment_calculate_slices
                     ((size_t)in_stack_ffffffffffffff70,
                      (size_t *)
                      CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  sVar2 = _mi_current_thread_count();
  allow_purge = false;
  if (1 < sVar2) {
    in_stack_ffffffffffffff70 = (mi_segments_tld_t *)in_RCX[0x24].peak;
    pmVar3 = (mi_segments_tld_t *)mi_option_get(in_stack_ffffffffffffff4c);
    allow_purge = in_stack_ffffffffffffff70 < pmVar3;
  }
  _Var8 = false;
  if ((bool)allow_purge == false) {
    _Var8 = mi_option_is_enabled(mi_option_show_errors);
  }
  uVar7 = (uint)(_Var8 != false || in_RDI != 0);
  local_8 = mi_segment_os_alloc(in_stack_00000028,in_stack_00000020,in_stack_0000001f,
                                in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                (_Bool)unaff_retaddr,(mi_segments_tld_t *)slice_entries);
  if (local_8 == (mi_segment_t *)0x0) {
    local_8 = (mi_segment_t *)0x0;
  }
  else {
    if (((local_8->memid).initially_zero & 1U) == 0) {
      in_stack_ffffffffffffff98 =
           (mi_segment_t *)((long)((long)&(pmVar1->memid).mem + 1) * 0x60 + 0x68);
      _mi_memzero(in_RCX,CONCAT44(in_stack_ffffffffffffff4c,uVar7));
    }
    local_a0 = pmVar1;
    if ((mi_segment_t *)0x200 < pmVar1) {
      local_a0 = (mi_segment_t *)0x200;
    }
    local_8->segment_slices = (size_t)pmVar1;
    local_8->segment_info_slices = local_38;
    mVar4 = _mi_thread_id();
    LOCK();
    local_8->thread_id = mVar4;
    UNLOCK();
    uVar5 = _mi_ptr_cookie(local_8);
    local_8->cookie = uVar5;
    local_8->slice_entries = (size_t)local_a0;
    local_8->kind = (uint)(in_RDI != 0);
    mi_segment_info_size(local_8);
    _mi_stat_increase(in_RCX,CONCAT44(in_stack_ffffffffffffff4c,uVar7));
    sVar2 = 0;
    pmVar6 = mi_segment_span_allocate(in_stack_ffffffffffffff98,(size_t)local_a0,0);
    if (pmVar6 == (mi_page_t *)0x0) {
      local_8 = (mi_segment_t *)0x0;
    }
    else {
      local_8->used = 0;
      if (local_8->kind == MI_SEGMENT_NORMAL) {
        mi_segment_span_free
                  (local_a0,sVar2,(size_t)pmVar6,(_Bool)allow_purge,in_stack_ffffffffffffff70);
      }
      else {
        pmVar6 = mi_segment_span_allocate(in_stack_ffffffffffffff98,(size_t)local_a0,sVar2);
        *in_R8 = pmVar6;
      }
    }
  }
  return local_8;
}

Assistant:

static mi_segment_t* mi_segment_alloc(size_t required, size_t page_alignment, mi_arena_id_t req_arena_id, mi_segments_tld_t* tld, mi_page_t** huge_page)
{
  mi_assert_internal((required==0 && huge_page==NULL) || (required>0 && huge_page != NULL));

  // calculate needed sizes first
  size_t info_slices;
  size_t segment_slices = mi_segment_calculate_slices(required, &info_slices);
  mi_assert_internal(segment_slices > 0 && segment_slices <= UINT32_MAX);

  // Commit eagerly only if not the first N lazy segments (to reduce impact of many threads that allocate just a little)
  const bool eager_delay = (// !_mi_os_has_overcommit() &&             // never delay on overcommit systems
                            _mi_current_thread_count() > 1 &&       // do not delay for the first N threads
                            tld->peak_count < (size_t)mi_option_get(mi_option_eager_commit_delay));
  const bool eager = !eager_delay && mi_option_is_enabled(mi_option_eager_commit);
  bool commit = eager || (required > 0);

  // Allocate the segment from the OS
  mi_segment_t* segment = mi_segment_os_alloc(required, page_alignment, eager_delay, req_arena_id,
                                              &segment_slices, &info_slices, commit, tld);
  if (segment == NULL) return NULL;

  // zero the segment info? -- not always needed as it may be zero initialized from the OS
  if (!segment->memid.initially_zero) {
    ptrdiff_t ofs    = offsetof(mi_segment_t, next);
    size_t    prefix = offsetof(mi_segment_t, slices) - ofs;
    size_t    zsize  = prefix + (sizeof(mi_slice_t) * (segment_slices + 1)); // one more
    _mi_memzero((uint8_t*)segment + ofs, zsize);
  }

  // initialize the rest of the segment info
  const size_t slice_entries = (segment_slices > MI_SLICES_PER_SEGMENT ? MI_SLICES_PER_SEGMENT : segment_slices);
  segment->segment_slices = segment_slices;
  segment->segment_info_slices = info_slices;
  segment->thread_id = _mi_thread_id();
  segment->cookie = _mi_ptr_cookie(segment);
  segment->slice_entries = slice_entries;
  segment->kind = (required == 0 ? MI_SEGMENT_NORMAL : MI_SEGMENT_HUGE);

  // _mi_memzero(segment->slices, sizeof(mi_slice_t)*(info_slices+1));
  _mi_stat_increase(&tld->stats->page_committed, mi_segment_info_size(segment));

  // set up guard pages
  size_t guard_slices = 0;
  if (MI_SECURE>0) {
    // in secure mode, we set up a protected page in between the segment info
    // and the page data, and at the end of the segment.
    size_t os_pagesize = _mi_os_page_size();
    _mi_os_protect((uint8_t*)segment + mi_segment_info_size(segment) - os_pagesize, os_pagesize);
    uint8_t* end = (uint8_t*)segment + mi_segment_size(segment) - os_pagesize;
    mi_segment_ensure_committed(segment, end, os_pagesize);
    _mi_os_protect(end, os_pagesize);
    if (slice_entries == segment_slices) segment->slice_entries--; // don't use the last slice :-(
    guard_slices = 1;
  }

  // reserve first slices for segment info
  mi_page_t* page0 = mi_segment_span_allocate(segment, 0, info_slices);
  mi_assert_internal(page0!=NULL); if (page0==NULL) return NULL; // cannot fail as we always commit in advance
  mi_assert_internal(segment->used == 1);
  segment->used = 0; // don't count our internal slices towards usage

  // initialize initial free pages
  if (segment->kind == MI_SEGMENT_NORMAL) { // not a huge page
    mi_assert_internal(huge_page==NULL);
    mi_segment_span_free(segment, info_slices, segment->slice_entries - info_slices, false /* don't purge */, tld);
  }
  else {
    mi_assert_internal(huge_page!=NULL);
    mi_assert_internal(mi_commit_mask_is_empty(&segment->purge_mask));
    mi_assert_internal(mi_commit_mask_is_full(&segment->commit_mask));
    *huge_page = mi_segment_span_allocate(segment, info_slices, segment_slices - info_slices - guard_slices);
    mi_assert_internal(*huge_page != NULL); // cannot fail as we commit in advance
  }

  mi_assert_expensive(mi_segment_is_valid(segment,tld));
  return segment;
}